

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes.c
# Opt level: O0

void nes_write_header(FILE *f,int banks)

{
  int banks_local;
  FILE *f_local;
  
  memset(&header,0,0x10);
  builtin_memcpy(header.id,"NES\x1a",4);
  header.prg = (uchar)ines_prg;
  header.chr = (uchar)ines_chr;
  header.mapper[0] = (uchar)ines_mapper[0];
  header.mapper[1] = (uchar)ines_mapper[1];
  fwrite(&header,0x10,1,(FILE *)f);
  return;
}

Assistant:

void
nes_write_header(FILE *f, int banks)
{
    (void)banks;
	/* setup INES header */
	memset(&header, 0, sizeof(header));
	header.id[0] = 'N';
	header.id[1] = 'E';
	header.id[2] = 'S';
	header.id[3] = 26;
	header.prg = ines_prg;
	header.chr = ines_chr;
	header.mapper[0] = ines_mapper[0];
	header.mapper[1] = ines_mapper[1];

	/* write */
	fwrite(&header, sizeof(header), 1, f);
}